

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

bool ot::commissioner::coap::Message::IsValidOption(OptionType aNumber,OptionValue *aValue)

{
  size_t sVar1;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  OptionValue *aValue_local;
  OptionType aNumber_local;
  
  switch(aNumber) {
  case kIfMatch:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 9;
    break;
  default:
    aValue_local._7_1_ = false;
    break;
  case kUriHost:
    sVar1 = OptionValue::GetLength(aValue);
    local_21 = false;
    if (sVar1 != 0) {
      sVar1 = OptionValue::GetLength(aValue);
      local_21 = sVar1 < 0x100;
    }
    aValue_local._7_1_ = local_21;
    break;
  case kETag:
    sVar1 = OptionValue::GetLength(aValue);
    local_22 = false;
    if (sVar1 != 0) {
      sVar1 = OptionValue::GetLength(aValue);
      local_22 = sVar1 < 9;
    }
    aValue_local._7_1_ = local_22;
    break;
  case kIfNonMatch:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 == 0;
    break;
  case kUriPort:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 3;
    break;
  case kLocationPath:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 0x100;
    break;
  case kUriPath:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 0x100;
    break;
  case kContentFormat:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 3;
    break;
  case kMaxAge:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 5;
    break;
  case kUriQuery:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 0x100;
    break;
  case kAccept:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 3;
    break;
  case kLocationQuery:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 0x100;
    break;
  case kProxyUri:
    sVar1 = OptionValue::GetLength(aValue);
    local_23 = false;
    if (sVar1 != 0) {
      sVar1 = OptionValue::GetLength(aValue);
      local_23 = sVar1 < 0x40b;
    }
    aValue_local._7_1_ = local_23;
    break;
  case kProxyScheme:
    sVar1 = OptionValue::GetLength(aValue);
    local_24 = false;
    if (sVar1 != 0) {
      sVar1 = OptionValue::GetLength(aValue);
      local_24 = sVar1 < 0x100;
    }
    aValue_local._7_1_ = local_24;
    break;
  case kSize1:
    sVar1 = OptionValue::GetLength(aValue);
    aValue_local._7_1_ = sVar1 < 5;
  }
  return aValue_local._7_1_;
}

Assistant:

bool Message::IsValidOption(OptionType aNumber, const OptionValue &aValue)
{
    switch (aNumber)
    {
    case OptionType::kIfMatch:
        return aValue.GetLength() <= 8;
    case OptionType::kUriHost:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 255;
    case OptionType::kETag:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 8;
    case OptionType::kIfNonMatch:
        return aValue.GetLength() == 0;
    case OptionType::kUriPort:
        return aValue.GetLength() <= 2;
    case OptionType::kLocationPath:
        return aValue.GetLength() <= 255;
    case OptionType::kUriPath:
        return aValue.GetLength() <= 255;
    case OptionType::kContentFormat:
        return aValue.GetLength() <= 2;
    case OptionType::kMaxAge:
        return aValue.GetLength() <= 4;
    case OptionType::kUriQuery:
        return aValue.GetLength() <= 255;
    case OptionType::kAccept:
        return aValue.GetLength() <= 2;
    case OptionType::kLocationQuery:
        return aValue.GetLength() <= 255;
    case OptionType::kProxyUri:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 1034;
    case OptionType::kProxyScheme:
        return aValue.GetLength() >= 1 && aValue.GetLength() <= 255;
    case OptionType::kSize1:
        return aValue.GetLength() <= 4;
    default:
        return false;
    }
}